

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcf_re_repeat(int n,mpc_val_t **xs)

{
  char cVar1;
  int n_00;
  int num;
  mpc_val_t **xs_local;
  mpc_parser_t *pmStack_10;
  int n_local;
  
  if (xs[1] == (mpc_val_t *)0x0) {
    pmStack_10 = (mpc_parser_t *)*xs;
  }
  else {
    cVar1 = *xs[1];
    if (cVar1 == '*') {
      free(xs[1]);
      pmStack_10 = mpc_many(mpcf_strfold,(mpc_parser_t *)*xs);
    }
    else if (cVar1 == '+') {
      free(xs[1]);
      pmStack_10 = mpc_many1(mpcf_strfold,(mpc_parser_t *)*xs);
    }
    else if (cVar1 == '?') {
      free(xs[1]);
      pmStack_10 = mpc_maybe_lift((mpc_parser_t *)*xs,mpcf_ctor_str);
    }
    else {
      n_00 = *xs[1];
      free(xs[1]);
      pmStack_10 = mpc_count(n_00,mpcf_strfold,(mpc_parser_t *)*xs,free);
    }
  }
  return pmStack_10;
}

Assistant:

static mpc_val_t *mpcf_re_repeat(int n, mpc_val_t **xs) {
  int num;
  (void) n;
  if (xs[1] == NULL) { return xs[0]; }
  switch(((char*)xs[1])[0])
  {
    case '*': { free(xs[1]); return mpc_many(mpcf_strfold, xs[0]); }; break;
    case '+': { free(xs[1]); return mpc_many1(mpcf_strfold, xs[0]); }; break;
    case '?': { free(xs[1]); return mpc_maybe_lift(xs[0], mpcf_ctor_str); }; break;
    default:
      num = *(int*)xs[1];
      free(xs[1]);
  }

  return mpc_count(num, mpcf_strfold, xs[0], free);
}